

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall ChainstateManager::DetectSnapshotChainstate(ChainstateManager *this)

{
  long lVar1;
  uint256 base_blockhash_00;
  path chaindir;
  undefined1 uVar2;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  _List in_stack_ffffffffffffff38;
  string local_c0;
  path local_a0;
  optional<uint256> base_blockhash;
  optional<fs::path> path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_snapshot_chainstate)._M_t.
      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) {
    __assert_fail("!m_snapshot_chainstate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1877,"bool ChainstateManager::DetectSnapshotChainstate()");
  }
  ::node::FindSnapshotChainstateDir(&path,&(this->m_options).datadir);
  if (path.super__Optional_base<fs::path,_false,_false>._M_payload.
      super__Optional_payload<fs::path,_true,_false,_false>.super__Optional_payload_base<fs::path>.
      _M_engaged == true) {
    std::filesystem::__cxx11::path::path(&local_a0,(path *)&path);
    chaindir.super_path._M_pathname._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff1c;
    chaindir.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffff18;
    chaindir.super_path._M_pathname._M_string_length = in_stack_ffffffffffffff20;
    chaindir.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_ffffffffffffff28;
    chaindir.super_path._M_pathname.field_2._8_8_ = in_stack_ffffffffffffff30;
    chaindir.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         in_stack_ffffffffffffff38._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    ::node::ReadSnapshotBaseBlockhash(&base_blockhash,chaindir);
    std::filesystem::__cxx11::path::~path(&local_a0);
    uVar2 = base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_engaged;
    if (base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged != false) {
      std::filesystem::__cxx11::path::string(&local_c0,(path *)&path);
      logging_function._M_str = "DetectSnapshotChainstate";
      logging_function._M_len = 0x18;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x1881,ALL,Info,(ConstevalFormatString<1U>)0x6c6807,
                 &local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[8] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._8_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[9] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._9_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[10] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._10_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0xb] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._11_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0xc] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._12_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0xd] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._13_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0xe] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._14_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0xf] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._15_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._0_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[1] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._1_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[2] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._2_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[3] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._3_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[4] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._4_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[5] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._5_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[6] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._6_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[7] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._7_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x10] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._16_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x11] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._17_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x12] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._18_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x13] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._19_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x14] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._20_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x15] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._21_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x16] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._22_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x17] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._23_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x18] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._24_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x19] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._25_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._26_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._27_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._28_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._29_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._30_1_;
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
           base_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._31_1_;
      ActivateExistingSnapshot(this,base_blockhash_00);
    }
  }
  else {
    uVar2 = 0;
  }
  std::_Optional_payload_base<fs::path>::_M_reset((_Optional_payload_base<fs::path> *)&path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::DetectSnapshotChainstate()
{
    assert(!m_snapshot_chainstate);
    std::optional<fs::path> path = node::FindSnapshotChainstateDir(m_options.datadir);
    if (!path) {
        return false;
    }
    std::optional<uint256> base_blockhash = node::ReadSnapshotBaseBlockhash(*path);
    if (!base_blockhash) {
        return false;
    }
    LogPrintf("[snapshot] detected active snapshot chainstate (%s) - loading\n",
        fs::PathToString(*path));

    this->ActivateExistingSnapshot(*base_blockhash);
    return true;
}